

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

void __thiscall
CVmObjStringBuffer::to_utf8(CVmObjStringBuffer *this,char *buf,int32_t *idx,int32_t *bytelen)

{
  wchar_t ch;
  int *piVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  int32_t iVar5;
  vm_strbuf_ext *ext;
  
  piVar1 = (int *)(this->super_CVmObject).ext_;
  iVar2 = *idx;
  if (iVar2 < 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = *piVar1;
    if (iVar2 <= *piVar1) goto LAB_002b312f;
  }
  iVar2 = iVar4;
  *idx = iVar2;
LAB_002b312f:
  iVar4 = *bytelen;
  iVar5 = 0;
  if (0 < iVar4) {
    do {
      if (*piVar1 <= iVar2) break;
      ch = piVar1[(long)iVar2 + 3];
      iVar2 = 3 - (uint)((uint)ch < 0x800);
      if (ch < L'\x80') {
        iVar2 = 1;
      }
      if (iVar4 - iVar5 < iVar2) break;
      sVar3 = utf8_ptr::s_putch(buf,ch);
      buf = buf + sVar3;
      iVar5 = iVar5 + iVar2;
      iVar2 = *idx + 1;
      *idx = iVar2;
      iVar4 = *bytelen;
    } while (iVar5 < iVar4);
  }
  *bytelen = iVar5;
  return;
}

Assistant:

void CVmObjStringBuffer::to_utf8(char *buf, int32_t &idx, int32_t &bytelen)
{
    vm_strbuf_ext *ext = get_ext();

    /* keep the index within our limits */
    adjust_args(&idx, 0, 0);

    /* we haven't copied any bytes yet */
    int32_t actual = 0;

    /* set up a utf8 pointer for the output buffer */
    utf8_ptr dst(buf);

    /* 
     *   copy characters until we reach the end of the string, or exhaust the
     *   requested number of bytes 
     */
    for (actual = 0 ; actual < bytelen && idx < (int32_t)ext->len ; ++idx)
    {
        /* get the next source character */
        wchar_t c = ext->buf[idx];
        int clen = utf8_ptr::s_wchar_size(c);
        
        /* make sure it fits in the remaining output buffer space */
        if (clen > bytelen - actual)
            break;

        /* store the character */
        dst.setch(c);

        /* count it in the output size */
        actual += clen;
    }

    /* return the actual length copied in bytelen */
    bytelen = actual;
}